

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_exporter.cpp
# Opt level: O1

void Assimp::WriteFormatInfo(JSONWriter *out)

{
  undefined1 *this;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  string local_38;
  
  out->first = true;
  this = &out->field_0x58;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,"{\n",2);
  std::__cxx11::string::push_back((char)out + '\b');
  paVar1 = &local_38.field_2;
  local_38._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"format","");
  JSONWriter::Key(out,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != paVar1) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  JSONWriter::SimpleValue<char[14]>(out,(char (*) [14])"\"assimp2json\"");
  local_38._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"version","");
  JSONWriter::Key(out,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != paVar1) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  std::ostream::operator<<(this,100);
  local_38._M_dataplus._M_p._0_1_ = 10;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,(char *)&local_38,1);
  JSONWriter::EndObj(out);
  return;
}

Assistant:

void WriteFormatInfo(JSONWriter& out) {
    out.StartObj();
    out.Key("format");
    out.SimpleValue("\"assimp2json\"");
    out.Key("version");
    out.SimpleValue(CURRENT_FORMAT_VERSION);
    out.EndObj();
}